

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ashared_ptr.h
# Opt level: O1

void __thiscall ashared_ptr<MapWrapper>::reset(ashared_ptr<MapWrapper> *this)

{
  PtrWrapper<MapWrapper> *target;
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar1 == 0) {
    target = (this->object)._M_b._M_p;
    (this->object)._M_b._M_p = (__pointer_type)0x0;
    releaseObject(this,target);
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void reset() {
        std::lock_guard<std::mutex> l(lock);
        PtrWrapper<T>* ptr = object.load(MO);
        // Unlink pointer first, destroy object next.
        object.store(nullptr, MO);
        releaseObject(ptr);
    }